

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVarLengthArray<char16_t,_256LL>::QVarLengthArray
          (QVarLengthArray<char16_t,_256LL> *this,qsizetype asize)

{
  (this->super_QVLABase<char16_t>).super_QVLABaseBase.a = 0x100;
  (this->super_QVLABase<char16_t>).super_QVLABaseBase.s = 0;
  (this->super_QVLABase<char16_t>).super_QVLABaseBase.ptr =
       &this->super_QVLAStorage<2UL,_2UL,_256LL>;
  if (0x100 < asize) {
    QVarLengthArray<char16_t,256ll>::QVarLengthArray();
  }
  (this->super_QVLABase<char16_t>).super_QVLABaseBase.s = asize;
  return;
}

Assistant:

Q_INLINE_TEMPLATE QVarLengthArray<T, Prealloc>::QVarLengthArray(qsizetype asize)
    : QVarLengthArray()
{
    Q_ASSERT_X(asize >= 0, "QVarLengthArray::QVarLengthArray(qsizetype)",
               "Size must be greater than or equal to 0.");

    // historically, this ctor worked for non-copyable/non-movable T, so keep it working, why not?
    // resize(asize) // this requires a movable or copyable T, can't use, need to do it by hand

    if (asize > Prealloc) {
        this->a = asize;
        this->ptr = QtPrivate::fittedMalloc(0, &this->a, sizeof(T));
        Q_CHECK_PTR(this->ptr);
    }
    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_default_construct_n(data(), asize);
    this->s = asize;
}